

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thriftl.cc
# Opt level: O0

void yypop_buffer_state(void)

{
  YY_BUFFER_STATE local_20;
  YY_BUFFER_STATE local_18;
  YY_BUFFER_STATE local_10;
  
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    local_10 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_10 = yy_buffer_stack[yy_buffer_stack_top];
  }
  if (local_10 != (YY_BUFFER_STATE)0x0) {
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      local_18 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_18 = yy_buffer_stack[yy_buffer_stack_top];
    }
    yy_delete_buffer(local_18);
    yy_buffer_stack[yy_buffer_stack_top] = (YY_BUFFER_STATE)0x0;
    if (yy_buffer_stack_top != 0) {
      yy_buffer_stack_top = yy_buffer_stack_top - 1;
    }
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      local_20 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_20 = yy_buffer_stack[yy_buffer_stack_top];
    }
    if (local_20 != (YY_BUFFER_STATE)0x0) {
      yy_load_buffer_state();
      yy_did_buffer_switch_on_eof = 1;
    }
  }
  return;
}

Assistant:

void yypop_buffer_state (void)
{
    	if (!YY_CURRENT_BUFFER)
		return;

	yy_delete_buffer(YY_CURRENT_BUFFER );
	YY_CURRENT_BUFFER_LVALUE = NULL;
	if ((yy_buffer_stack_top) > 0)
		--(yy_buffer_stack_top);

	if (YY_CURRENT_BUFFER) {
		yy_load_buffer_state(  );
		(yy_did_buffer_switch_on_eof) = 1;
	}
}